

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

ptr<Member> __thiscall Environment::getMember(Environment *this,Identifier *ident)

{
  mapped_type *pmVar1;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Member> pVar2;
  Identifier local_70;
  Symbol local_50;
  Identifier *ident_local;
  Environment *this_local;
  
  ident_local = ident;
  this_local = this;
  std::__cxx11::string::string((string *)&local_70,in_RDX);
  Symbol::Symbol(&local_50,&local_70);
  pmVar1 = std::
           unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
           ::operator[]((unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
                         *)ident,&local_50);
  std::shared_ptr<Member>::shared_ptr((shared_ptr<Member> *)this,pmVar1);
  Symbol::~Symbol(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Member>)pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Member> Environment::getMember(const Identifier &ident) {
    return symbols[ident];
}